

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

quintptr __thiscall QDockAreaLayoutInfo::currentTabId(QDockAreaLayoutInfo *this)

{
  int index_00;
  QTabBar *in_RDI;
  long in_FS_OFFSET;
  int index;
  QTabBar *in_stack_ffffffffffffffa8;
  QVariant *in_stack_ffffffffffffffb0;
  unsigned_long_long local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI[2].super_QWidget.field_0x8 & 1) == 0) ||
     (*(long *)&in_RDI[2].super_QWidget.super_QPaintDevice == 0)) {
    local_30 = 0;
  }
  else {
    index_00 = QTabBar::currentIndex(in_stack_ffffffffffffffa8);
    if (index_00 == -1) {
      local_30 = 0;
    }
    else {
      QTabBar::tabData(in_RDI,index_00);
      local_30 = qvariant_cast<unsigned_long_long>(in_stack_ffffffffffffffb0);
      ::QVariant::~QVariant(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

quintptr QDockAreaLayoutInfo::currentTabId() const
{
    if (!tabbed || tabBar == nullptr)
        return 0;

    int index = tabBar->currentIndex();
    if (index == -1)
        return 0;

    return qvariant_cast<quintptr>(tabBar->tabData(index));
}